

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOCommunicationsNode.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::IOCommunicationsNode::Encode(IOCommunicationsNode *this,KDataStream *stream)

{
  StandardVariable::Encode(&this->super_StandardVariable,stream);
  KDataStream::Write(stream,(this->super_StandardVariable).field_0xe);
  KDataStream::Write(stream,(this->super_StandardVariable).field_0xf);
  (*(this->m_CommID).super_EntityIdentifier.super_SimulationIdentifier.super_DataTypeBase.
    _vptr_DataTypeBase[5])(&this->m_CommID,stream);
  return;
}

Assistant:

void IOCommunicationsNode::Encode( KDataStream & stream ) const
{
    StandardVariable::Encode( stream );

    stream << m_ui8CommNodeTyp
           << m_ui8Padding
           << KDIS_STREAM m_CommID;
}